

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_input.cpp
# Opt level: O2

InputList * __thiscall Omega_h::InputMap::get_list(InputMap *this,string *name)

{
  bool bVar1;
  InputList *pIVar2;
  shared_ptr<Omega_h::Input> sptr;
  
  bVar1 = is_input<Omega_h::InputList>(this,name);
  if (!bVar1) {
    pIVar2 = (InputList *)operator_new(0x30);
    (pIVar2->super_Input)._vptr_Input = (_func_int **)0x0;
    (pIVar2->super_Input).parent = (Input *)0x0;
    *(undefined8 *)&(pIVar2->super_Input).used = 0;
    (pIVar2->entries).
    super__Vector_base<std::shared_ptr<Omega_h::Input>,_std::allocator<std::shared_ptr<Omega_h::Input>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pIVar2->super_Input)._vptr_Input = (_func_int **)&PTR__InputList_00410900;
    (pIVar2->entries).
    super__Vector_base<std::shared_ptr<Omega_h::Input>,_std::allocator<std::shared_ptr<Omega_h::Input>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pIVar2->entries).
    super__Vector_base<std::shared_ptr<Omega_h::Input>,_std::allocator<std::shared_ptr<Omega_h::Input>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pIVar2->entries).
    super__Vector_base<std::shared_ptr<Omega_h::Input>,_std::allocator<std::shared_ptr<Omega_h::Input>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__shared_ptr<Omega_h::Input,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<Omega_h::InputList,void>
              ((__shared_ptr<Omega_h::Input,(__gnu_cxx::_Lock_policy)2> *)&sptr,pIVar2);
    add(this,name,&sptr);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&sptr.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  pIVar2 = use_input<Omega_h::InputList>(this,name);
  return pIVar2;
}

Assistant:

InputList& InputMap::get_list(std::string const& name) {
  if (!is_list(name)) {
    std::shared_ptr<Input> sptr(new InputList());
    this->add(name, std::move(sptr));
  }
  return this->use_input<InputList>(name);
}